

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  string *psVar4;
  reference s;
  ulong uVar5;
  reference pvVar6;
  cmState *this_01;
  ostream *poVar7;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *this_02;
  reference this_03;
  pointer pcVar8;
  PolicyID id;
  bool local_aa5;
  byte local_911;
  cmStateDirectory local_8d8;
  undefined1 local_8b0 [8];
  string odir;
  string local_888;
  cmStateDirectory local_868;
  reference local_840;
  cmStateSnapshot *c_1;
  iterator __end3;
  iterator __begin3;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range3;
  undefined1 local_808 [8];
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string local_7d0;
  undefined1 local_7b0 [8];
  ostringstream e;
  allocator<char> local_631;
  string local_630;
  reference local_610;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *installer_1;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range2_2;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *installer;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range2_1;
  bool haveInstallAfterSubdirectory;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *pvStack_5c8;
  bool haveSubdirectoryInstall;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *installers;
  PolicyStatus status;
  cmValue local_598;
  cmValue command_2;
  string local_588;
  cmValue local_568;
  cmValue command_1;
  string local_558;
  cmValue local_538;
  cmValue command;
  string local_528;
  cmValue local_508;
  cmValue platform;
  string local_4f8;
  cmValue local_4d8;
  cmValue defaultDirPermissions;
  string local_4c8;
  cmValue local_4a8;
  cmValue crosscompiling;
  string local_498;
  cmValue local_478;
  cmValue so_no_exe;
  undefined1 local_448 [8];
  cmGeneratedFileStream fout;
  undefined1 local_1d8 [4];
  int toplevel_install;
  string homedir;
  undefined1 local_190 [8];
  string file;
  string *configurationType;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  char **c;
  char *default_order [5];
  string local_f8 [8];
  string default_config;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_98;
  cmValue local_78;
  cmValue stagingPrefix;
  string prefix;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmValue installPrefix;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  installPrefix.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_INSTALL_PREFIX",&local_39);
  local_18 = cmMakefile::GetDefinition(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  psVar4 = cmValue::operator_cast_to_string_(&local_18);
  std::__cxx11::string::string((string *)&stagingPrefix,(string *)psVar4);
  bVar2 = cmValue::operator_cast_to_bool(&local_18);
  if (!bVar2) {
    std::__cxx11::string::operator=((string *)&stagingPrefix,"/usr/local");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_STAGING_PREFIX",
             (allocator<char> *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_78 = cmMakefile::GetDefinition(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_78);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_78);
    std::__cxx11::string::operator=((string *)&stagingPrefix,(string *)psVar4);
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&config.field_2 + 8),this->Makefile,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_
            ((string *)((long)&default_config.field_2 + 8),this->Makefile);
  std::__cxx11::string::string(local_f8,(string *)(default_config.field_2._M_local_buf + 8));
  memcpy(&c,&DAT_01103570,0x28);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&c;
  while( true ) {
    local_911 = 0;
    if ((__range2->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      local_911 = std::__cxx11::string::empty();
    }
    if ((local_911 & 1) == 0) break;
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&config.field_2 + 8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    configurationType =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&configurationType), bVar2) {
      s = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
      cmsys::SystemTools::UpperCase((string *)((long)&file.field_2 + 8),s);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&file.field_2 + 8),
                              (char *)(__range2->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      if (bVar2) {
        std::__cxx11::string::operator=(local_f8,(string *)s);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(__range2->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) &&
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&config.field_2 + 8)), !bVar2)) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&config.field_2 + 8),0);
    std::__cxx11::string::operator=(local_f8,(string *)pvVar6);
  }
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)((long)&homedir.field_2 + 8),
             &(this->super_cmOutputConverter).StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                     ((cmStateDirectory *)((long)&homedir.field_2 + 8));
  std::__cxx11::string::string((string *)local_190,(string *)psVar4);
  this_01 = GetState(this);
  psVar4 = cmState::GetBinaryDirectory_abi_cxx11_(this_01);
  std::__cxx11::string::string((string *)local_1d8,(string *)psVar4);
  fout._612_4_ = 0;
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_190,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1d8);
  if (_Var3) {
    fout._612_4_ = 1;
  }
  std::__cxx11::string::operator+=((string *)local_190,"/cmake_install.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_448,(string *)local_190,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_448,true);
  poVar7 = std::operator<<((ostream *)local_448,"# Install script for directory: ");
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)&so_no_exe,&(this->super_cmOutputConverter).StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&so_no_exe);
  poVar7 = std::operator<<(poVar7,(string *)psVar4);
  poVar7 = std::operator<<(poVar7,
                           "\n\n# Set the install prefix\nif(NOT DEFINED CMAKE_INSTALL_PREFIX)\n  set(CMAKE_INSTALL_PREFIX \""
                          );
  poVar7 = std::operator<<(poVar7,(string *)&stagingPrefix);
  poVar7 = std::operator<<(poVar7,"\")\nendif()\n");
  poVar7 = std::operator<<(poVar7,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ");
  std::operator<<(poVar7,"\"${CMAKE_INSTALL_PREFIX}\")\n\n");
  poVar7 = std::operator<<((ostream *)local_448,
                           "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
                          );
  poVar7 = std::operator<<(poVar7,local_f8);
  std::operator<<(poVar7,
                  "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
                 );
  std::operator<<((ostream *)local_448,
                  "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
                 );
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"CMAKE_INSTALL_SO_NO_EXE",
             (allocator<char> *)((long)&crosscompiling.Value + 7));
  local_478 = cmMakefile::GetDefinition(pcVar1,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)((long)&crosscompiling.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_478);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
                            );
    psVar4 = cmValue::operator*[abi_cxx11_(&local_478);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"CMAKE_CROSSCOMPILING",
             (allocator<char> *)((long)&defaultDirPermissions.Value + 7));
  local_4a8 = cmMakefile::GetDefinition(pcVar1,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&defaultDirPermissions.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_4a8);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
                            );
    psVar4 = cmValue::operator*[abi_cxx11_(&local_4a8);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
             (allocator<char> *)((long)&platform.Value + 7));
  local_4d8 = cmMakefile::GetDefinition(pcVar1,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&platform.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_4d8);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
                            );
    psVar4 = cmValue::operator*[abi_cxx11_(&local_4d8);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM",
             (allocator<char> *)((long)&command.Value + 7));
  local_508 = cmMakefile::GetDefinition(pcVar1,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)((long)&command.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_508);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
                            );
    psVar4 = cmValue::operator*[abi_cxx11_(&local_508);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL",
             (allocator<char> *)((long)&command_1.Value + 7));
  local_538 = cmMakefile::GetDefinition(pcVar1,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)((long)&command_1.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_538);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
                            );
    psVar4 = cmValue::operator*[abi_cxx11_(&local_538);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND",
             (allocator<char> *)((long)&command_2.Value + 7));
  local_568 = cmMakefile::GetDefinition(pcVar1,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)((long)&command_2.Value + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_568);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
                            );
    psVar4 = cmValue::operator*[abi_cxx11_(&local_568);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"CMAKE_OBJDUMP",(allocator<char> *)((long)&installers + 7));
  local_598 = cmMakefile::GetDefinition(pcVar1,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::allocator<char>::~allocator((allocator<char> *)((long)&installers + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_598);
  if (bVar2) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_OBJDUMP)\n  set(CMAKE_OBJDUMP \""
                            );
    psVar4 = cmValue::operator*[abi_cxx11_(&local_598);
    poVar7 = std::operator<<(poVar7,(string *)psVar4);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  (*this->_vptr_cmLocalGenerator[0x12])(this,local_448);
  installers._0_4_ = GetPolicyStatus(this,CMP0082);
  this_02 = cmMakefile::GetInstallGenerators(this->Makefile);
  __range2_1._7_1_ = 0;
  __range2_1._6_1_ = 0;
  pvStack_5c8 = this_02;
  if ((PolicyStatus)installers == WARN) {
    __end2_1 = std::
               vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
               ::begin(this_02);
    installer = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                std::
                vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                ::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                               *)&installer), bVar2) {
      this_03 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                ::operator*(&__end2_1);
      pcVar8 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
               operator->(this_03);
      (*(pcVar8->super_cmScriptGenerator)._vptr_cmScriptGenerator[9])
                (pcVar8,(long)&__range2_1 + 7,(long)&__range2_1 + 6);
      pcVar8 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
               operator->(this_03);
      cmScriptGenerator::Generate
                (&pcVar8->super_cmScriptGenerator,(ostream *)local_448,
                 (string *)((long)&default_config.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&config.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  else {
    __end2_2 = std::
               vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
               ::begin(this_02);
    installer_1 = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                  std::
                  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                  ::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                               *)&installer_1), bVar2) {
      local_610 = __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                  ::operator*(&__end2_2);
      pcVar8 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
               operator->(local_610);
      cmScriptGenerator::Generate
                (&pcVar8->super_cmScriptGenerator,(ostream *)local_448,
                 (string *)((long)&default_config.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&config.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
      ::operator++(&__end2_2);
    }
  }
  GenerateTargetInstallRules
            (this,(ostream *)local_448,(string *)((long)&default_config.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&config.field_2 + 8));
  if ((PolicyStatus)installers != OLD) {
    if ((PolicyStatus)installers != WARN) goto LAB_003cb9ef;
    local_aa5 = false;
    if ((__range2_1._6_1_ & 1) != 0) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_630,"CMAKE_POLICY_WARNING_CMP0082",&local_631);
      local_aa5 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::allocator<char>::~allocator(&local_631);
    }
    if (local_aa5 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7b0);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_7d0,(cmPolicies *)0x52,id);
      poVar7 = std::operator<<((ostream *)local_7b0,(string *)&local_7d0);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&local_7d0);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,
                   (string *)
                   &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7b0);
    }
  }
  cmMakefile::GetStateSnapshot((cmStateSnapshot *)&__range3,this->Makefile);
  cmStateSnapshot::GetChildren
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_808,
             (cmStateSnapshot *)&__range3);
  bVar2 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::empty
                    ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_808);
  if (!bVar2) {
    std::operator<<((ostream *)local_448,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    std::operator<<((ostream *)local_448,"  # Include the install script for each subdirectory.\n");
    __end3 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin
                       ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_808);
    c_1 = (cmStateSnapshot *)
          std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end
                    ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_808);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                       *)&c_1), bVar2) {
      local_840 = __gnu_cxx::
                  __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                  ::operator*(&__end3);
      cmStateSnapshot::GetDirectory(&local_868,local_840);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_888,"EXCLUDE_FROM_ALL",
                 (allocator<char> *)(odir.field_2._M_local_buf + 0xf));
      bVar2 = cmStateDirectory::GetPropertyAsBool(&local_868,&local_888);
      std::__cxx11::string::~string((string *)&local_888);
      std::allocator<char>::~allocator((allocator<char> *)(odir.field_2._M_local_buf + 0xf));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        cmStateSnapshot::GetDirectory(&local_8d8,local_840);
        psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_8d8);
        std::__cxx11::string::string((string *)local_8b0,(string *)psVar4);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_8b0);
        poVar7 = std::operator<<((ostream *)local_448,"  include(\"");
        poVar7 = std::operator<<(poVar7,(string *)local_8b0);
        std::operator<<(poVar7,"/cmake_install.cmake\")\n");
        std::__cxx11::string::~string((string *)local_8b0);
      }
      __gnu_cxx::
      __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
      ::operator++(&__end3);
    }
    std::operator<<((ostream *)local_448,"\n");
    std::operator<<((ostream *)local_448,"endif()\n\n");
  }
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_808);
LAB_003cb9ef:
  if (fout._612_4_ != 0) {
    poVar7 = std::operator<<((ostream *)local_448,
                             "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
                            );
    poVar7 = std::operator<<(poVar7,(string *)local_1d8);
    std::operator<<(poVar7,
                    "/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_448);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)(default_config.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  std::__cxx11::string::~string((string *)&stagingPrefix);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  cmValue installPrefix =
    this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
  std::string prefix = installPrefix;

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (!installPrefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix)) {
      prefix = "C:";
    }
    cmValue project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (cmNonempty(project_name)) {
      prefix += "/Program Files/";
      prefix += *project_name;
    } else {
      prefix += "/InstalledCMakeProject";
    }
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!installPrefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!installPrefix) {
    prefix = "/usr/local";
  }
#endif
  if (cmValue stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = *stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", nullptr };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::string const& configurationType : configurationTypes) {
      if (cmSystemTools::UpperCase(configurationType) == *c) {
        default_config = configurationType;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  // Write the header.
  /* clang-format off */
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n\n"
          "# Set the install prefix\n"
          "if(NOT DEFINED CMAKE_INSTALL_PREFIX)\n"
          "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")\n"
          "endif()\n"
       << R"(string(REGEX REPLACE "/$" "" CMAKE_INSTALL_PREFIX )"
       << "\"${CMAKE_INSTALL_PREFIX}\")\n\n";
  /* clang-format on */

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (cmValue so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << *so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (cmValue crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << *crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write default directory permissions.
  if (cmValue defaultDirPermissions = this->Makefile->GetDefinition(
        "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n"
      "  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
         << *defaultDirPermissions << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same platform variable as when running cmake
  if (cmValue platform = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
         << *platform << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same tool selected as when running cmake
  if (cmValue command =
        this->Makefile->GetDefinition("CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same path to the tool as when running cmake
  if (cmValue command = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_OBJDUMP so that installed code that uses
  // `file(GET_RUNTIME_DEPENDENCIES)` and hasn't specified
  // CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND has consistent
  // logic to fallback to CMAKE_OBJDUMP when `objdump` is
  // not on the path
  if (cmValue command = this->Makefile->GetDefinition("CMAKE_OBJDUMP")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_OBJDUMP)\n"
      "  set(CMAKE_OBJDUMP \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  this->AddGeneratorSpecificInstallSetup(fout);

  // Ask each install generator to write its code.
  cmPolicies::PolicyStatus status = this->GetPolicyStatus(cmPolicies::CMP0082);
  auto const& installers = this->Makefile->GetInstallGenerators();
  bool haveSubdirectoryInstall = false;
  bool haveInstallAfterSubdirectory = false;
  if (status == cmPolicies::WARN) {
    for (const auto& installer : installers) {
      installer->CheckCMP0082(haveSubdirectoryInstall,
                              haveInstallAfterSubdirectory);
      installer->Generate(fout, config, configurationTypes);
    }
  } else {
    for (const auto& installer : installers) {
      installer->Generate(fout, config, configurationTypes);
    }
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  switch (status) {
    case cmPolicies::WARN:
      if (haveInstallAfterSubdirectory &&
          this->Makefile->PolicyOptionalWarningEnabled(
            "CMAKE_POLICY_WARNING_CMP0082")) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0082) << "\n";
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      std::vector<cmStateSnapshot> children =
        this->Makefile->GetStateSnapshot().GetChildren();
      if (!children.empty()) {
        fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
        fout << "  # Include the install script for each subdirectory.\n";
        for (cmStateSnapshot const& c : children) {
          if (!c.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
            std::string odir = c.GetDirectory().GetCurrentBinary();
            cmSystemTools::ConvertToUnixSlashes(odir);
            fout << "  include(\"" << odir << "/cmake_install.cmake\")\n";
          }
        }
        fout << "\n";
        fout << "endif()\n\n";
      }
    } break;

    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is handled in
      // cmInstallSubdirectoryGenerator::GenerateScript()
      break;
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}